

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psconv.c
# Opt level: O2

FT_Fixed PS_Conv_ToFixed(FT_Byte **cursor,FT_Byte *limit,FT_Long power_ten)

{
  bool bVar1;
  byte *pbVar2;
  FT_Byte FVar3;
  FT_Long FVar4;
  undefined8 extraout_RDX;
  undefined8 uVar5;
  ulong uVar6;
  FT_Byte *pFVar7;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long a_;
  bool bVar13;
  FT_Byte *p;
  ulong local_40;
  undefined8 local_38;
  
  pFVar7 = *cursor;
  if (limit <= pFVar7) {
    return 0;
  }
  FVar3 = *pFVar7;
  if ((FVar3 == '-') || (FVar3 == '+')) {
    pFVar7 = pFVar7 + 1;
    if (pFVar7 == limit) {
      return 0;
    }
    bVar13 = FVar3 == '-';
    FVar3 = *pFVar7;
    if (FVar3 == '+') {
      return 0;
    }
    if (FVar3 == '-') {
      return 0;
    }
  }
  else {
    bVar13 = false;
  }
  p = pFVar7;
  if (FVar3 == '.') {
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    uVar6 = PS_Conv_ToInt(&p,limit);
    if (p == pFVar7) {
      return 0;
    }
    uVar5 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    if ((long)uVar6 < 0x8000) {
      uVar6 = (ulong)(uint)((int)uVar6 << 0x10);
      uVar5 = 0;
    }
  }
  uVar12 = 1;
  if ((p < limit) && (*p == '.')) {
    a_ = 0;
    do {
      pbVar8 = p;
      do {
        p = p + 1;
        pbVar2 = limit;
        if (limit <= p) goto LAB_001f4661;
        pbVar8 = pbVar8 + 1;
        uVar9 = (ulong)*p;
        pbVar2 = pbVar8;
        if ((((uVar9 < 0x21) && ((0x100003601U >> (uVar9 & 0x3f) & 1) != 0)) || ((char)*p < '\0'))
           || (pbVar2 = p, uVar9 - 0x3a < 0xfffffffffffffff6)) goto LAB_001f4661;
      } while (0xccccccb < a_ || 0xccccccb < uVar12);
      a_ = a_ * 10 + (long)ft_char_table[uVar9];
      if ((uVar6 == 0) && (0 < power_ten)) {
        power_ten = power_ten - 1;
      }
      else {
        uVar12 = uVar12 * 10;
      }
    } while( true );
  }
  a_ = 0;
  pbVar2 = p;
LAB_001f4661:
  p = pbVar2;
  pFVar7 = p + 1;
  if ((pFVar7 < limit) && ((*p | 0x20) == 0x65)) {
    p = pFVar7;
    local_40 = uVar12;
    local_38 = uVar5;
    FVar4 = PS_Conv_ToInt(&p,limit);
    if (pFVar7 == p) {
      return 0;
    }
    uVar12 = local_40;
    if (FVar4 < 0x3e9) {
      bVar1 = -0x3e9 < FVar4;
      lVar11 = 0;
      if (-0x3e9 < FVar4) {
        lVar11 = FVar4;
      }
      power_ten = power_ten + lVar11;
      uVar5 = local_38;
      goto LAB_001f46cf;
    }
    uVar5 = 1;
  }
  bVar1 = true;
LAB_001f46cf:
  *cursor = p;
  if (uVar6 == 0 && a_ == 0) {
    return 0;
  }
  uVar9 = 0x7fffffff;
  if ((char)uVar5 == '\0') {
    if (!bVar1) {
      return 0;
    }
    uVar10 = power_ten >> 0x3f & power_ten;
    for (; 0 < power_ten; power_ten = power_ten - 1) {
      if (0xccccccb < uVar6) goto LAB_001f46e4;
      if (a_ < 0xccccccc) {
        a_ = a_ * 10;
      }
      else {
        if (uVar12 == 1) goto LAB_001f46e4;
        uVar12 = (long)uVar12 / 10;
      }
      uVar6 = uVar6 * 10;
    }
    lVar11 = uVar10 - 1;
    uVar9 = uVar6;
    while (lVar11 = lVar11 + 1, lVar11 != 0) {
      uVar6 = uVar9 / 10;
      if ((long)uVar12 < 0xccccccc) {
        uVar12 = uVar12 * 10;
      }
      else {
        a_ = a_ / 10;
      }
      bVar1 = uVar9 < 10;
      uVar9 = uVar6;
      if ((bVar1) && (a_ == 0)) {
        return 0;
      }
    }
    if (a_ != 0) {
      FVar4 = FT_DivFix(a_,uVar12);
      uVar9 = FVar4 + uVar9;
    }
  }
LAB_001f46e4:
  if (!bVar13) {
    return uVar9;
  }
  return -uVar9;
}

Assistant:

FT_LOCAL_DEF( FT_Fixed )
  PS_Conv_ToFixed( FT_Byte**  cursor,
                   FT_Byte*   limit,
                   FT_Long    power_ten )
  {
    FT_Byte*  p = *cursor;
    FT_Byte*  curp;

    FT_Fixed  integral = 0;
    FT_Long   decimal  = 0;
    FT_Long   divider  = 1;

    FT_Bool   sign           = 0;
    FT_Bool   have_overflow  = 0;
    FT_Bool   have_underflow = 0;


    if ( p >= limit )
      goto Bad;

    if ( *p == '-' || *p == '+' )
    {
      sign = FT_BOOL( *p == '-' );

      p++;
      if ( p == limit )
        goto Bad;

      /* only a single sign is allowed */
      if ( *p == '-' || *p == '+' )
        return 0;
    }

    /* read the integer part */
    if ( *p != '.' )
    {
      curp     = p;
      integral = PS_Conv_ToInt( &p, limit );

      if ( p == curp )
        return 0;

      if ( integral > 0x7FFF )
        have_overflow = 1;
      else
        integral = (FT_Fixed)( (FT_UInt32)integral << 16 );
    }

    /* read the decimal part */
    if ( p < limit && *p == '.' )
    {
      p++;

      for ( ; p < limit; p++ )
      {
        FT_Char  c;


        if ( IS_PS_SPACE( *p ) || *p OP 0x80 )
          break;

        c = ft_char_table[*p & 0x7F];

        if ( c < 0 || c >= 10 )
          break;

        /* only add digit if we don't overflow */
        if ( divider < 0xCCCCCCCL && decimal < 0xCCCCCCCL )
        {
          decimal = decimal * 10 + c;

          if ( !integral && power_ten > 0 )
            power_ten--;
          else
            divider *= 10;
        }
      }
    }

    /* read exponent, if any */
    if ( p + 1 < limit && ( *p == 'e' || *p == 'E' ) )
    {
      FT_Long  exponent;


      p++;

      curp     = p;
      exponent = PS_Conv_ToInt( &p, limit );

      if ( curp == p )
        return 0;

      /* arbitrarily limit exponent */
      if ( exponent > 1000 )
        have_overflow = 1;
      else if ( exponent < -1000 )
        have_underflow = 1;
      else
        power_ten += exponent;
    }

    *cursor = p;

    if ( !integral && !decimal )
      return 0;

    if ( have_overflow )
      goto Overflow;
    if ( have_underflow )
      goto Underflow;

    while ( power_ten > 0 )
    {
      if ( integral >= 0xCCCCCCCL )
        goto Overflow;
      integral *= 10;

      if ( decimal >= 0xCCCCCCCL )
      {
        if ( divider == 1 )
          goto Overflow;
        divider /= 10;
      }
      else
        decimal *= 10;

      power_ten--;
    }

    while ( power_ten < 0 )
    {
      integral /= 10;
      if ( divider < 0xCCCCCCCL )
        divider *= 10;
      else
        decimal /= 10;

      if ( !integral && !decimal )
        goto Underflow;

      power_ten++;
    }

    if ( decimal )
    {
      decimal = FT_DivFix( decimal, divider );
      /* it's not necessary to check this addition for overflow */
      /* due to the structure of the real number representation */
      integral += decimal;
    }

  Exit:
    if ( sign )
      integral = -integral;

    return integral;

  Bad:
    FT_TRACE4(( "!!!END OF DATA:!!!" ));
    return 0;

  Overflow:
    integral = 0x7FFFFFFFL;
    FT_TRACE4(( "!!!OVERFLOW:!!!" ));
    goto Exit;

  Underflow:
    FT_TRACE4(( "!!!UNDERFLOW:!!!" ));
    return 0;
  }